

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUILayout.cpp
# Opt level: O0

void __thiscall GUILayout::resetContext(GUILayout *this)

{
  lay_id lVar1;
  GUILayout *this_local;
  
  lay_reset_context(&this->m_lctx);
  std::vector<GUILayout::NamedElement_*,_std::allocator<GUILayout::NamedElement_*>_>::clear
            (&this->m_namedElements);
  lVar1 = item(this);
  this->m_root = lVar1;
  lay_set_size_xy(&this->m_lctx,this->m_root,(lay_scalar)(this->m_size).x,
                  (lay_scalar)(this->m_size).y);
  return;
}

Assistant:

void GUILayout::resetContext()
{
    lay_reset_context(&m_lctx);
    m_namedElements.clear();
    m_root = item();
    lay_set_size_xy(&m_lctx, m_root, lay_scalar(m_size.x), lay_scalar(m_size.y));
}